

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

bool __thiscall FIX::Initiator::isLoggedOn(Initiator *this)

{
  bool bVar1;
  reference sessionID;
  Session *this_00;
  _Self local_70;
  _Self local_68;
  iterator i;
  undefined1 local_50 [8];
  SessionIDs connected;
  Locker l;
  Initiator *this_local;
  
  Locker::Locker((Locker *)&connected._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 &this->m_mutex);
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::set
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             local_50,&this->m_connected);
  local_68._M_node =
       (_Base_ptr)
       std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::begin
                 ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *
                  )local_50);
  do {
    local_70._M_node =
         (_Base_ptr)
         std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                   ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
                     *)local_50);
    bVar1 = std::operator!=(&local_68,&local_70);
    if (!bVar1) {
      this_local._7_1_ = false;
LAB_00262e1b:
      std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
                ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
                 local_50);
      Locker::~Locker((Locker *)&connected._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return this_local._7_1_;
    }
    sessionID = std::_Rb_tree_const_iterator<FIX::SessionID>::operator*(&local_68);
    this_00 = Session::lookupSession(sessionID);
    bVar1 = Session::isLoggedOn(this_00);
    if (bVar1) {
      this_local._7_1_ = true;
      goto LAB_00262e1b;
    }
    std::_Rb_tree_const_iterator<FIX::SessionID>::operator++(&local_68);
  } while( true );
}

Assistant:

bool Initiator::isLoggedOn() const {
  Locker l(m_mutex);

  SessionIDs connected = m_connected;
  SessionIDs::iterator i = connected.begin();
  for (; i != connected.end(); ++i) {
    if (Session::lookupSession(*i)->isLoggedOn()) {
      return true;
    }
  }
  return false;
}